

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::GenerateBlockSyntax::GenerateBlockSyntax
          (GenerateBlockSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          NamedLabelSyntax *label,Token begin,NamedBlockClauseSyntax *beginName,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token end,NamedBlockClauseSyntax *endName
          )

{
  size_type sVar1;
  pointer ppAVar2;
  pointer ppMVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  long lVar7;
  
  uVar6 = begin._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = GenerateBlock;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  this->label = label;
  (this->begin).kind = (short)uVar6;
  (this->begin).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->begin).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->begin).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->begin).info = begin.info;
  this->beginName = beginName;
  SVar4 = (members->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
       (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar1 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed010;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  (this->end).info = end.info;
  this->endName = endName;
  if (label != (NamedLabelSyntax *)0x0) {
    (label->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (beginName != (NamedBlockClauseSyntax *)0x0) {
    (beginName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppMVar3 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppMVar3 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  if (endName != (NamedBlockClauseSyntax *)0x0) {
    (endName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

GenerateBlockSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, NamedLabelSyntax* label, Token begin, NamedBlockClauseSyntax* beginName, const SyntaxList<MemberSyntax>& members, Token end, NamedBlockClauseSyntax* endName) :
        MemberSyntax(SyntaxKind::GenerateBlock, attributes), label(label), begin(begin), beginName(beginName), members(members), end(end), endName(endName) {
        if (this->label) this->label->parent = this;
        if (this->beginName) this->beginName->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->endName) this->endName->parent = this;
    }